

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_0::CppGeneratorTest_StringTypeForStringFieldsOnly_Test
::TestBody(CppGeneratorTest_StringTypeForStringFieldsOnly_Test *this)

{
  string_view local_50;
  string_view local_40;
  string_view local_30;
  string_view local_20;
  CppGeneratorTest_StringTypeForStringFieldsOnly_Test *local_10;
  CppGeneratorTest_StringTypeForStringFieldsOnly_Test *this_local;
  
  local_10 = this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_20,"foo.proto");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_30,
             "\n    edition = \"2024\";\n    import \"google/protobuf/cpp_features.proto\";\n\n    message Foo {\n      int32 bar = 1;\n      int32 baz = 2 [features.(pb.cpp).string_type = CORD];\n    }\n  "
            );
  CommandLineInterfaceTester::CreateTempFile((CommandLineInterfaceTester *)this,local_20,local_30);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_40,
             "protocol_compiler --proto_path=$tmpdir --cpp_out=$tmpdir --experimental_editions foo.proto"
            );
  CommandLineInterfaceTester::RunProtoc((CommandLineInterfaceTester *)this,local_40);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_50,"Field Foo.baz specifies string_type, but is not a string nor bytes field.");
  CommandLineInterfaceTester::ExpectErrorSubstring((CommandLineInterfaceTester *)this,local_50);
  return;
}

Assistant:

TEST_F(CppGeneratorTest, StringTypeForStringFieldsOnly) {
  CreateTempFile("foo.proto", R"schema(
    edition = "2024";
    import "google/protobuf/cpp_features.proto";

    message Foo {
      int32 bar = 1;
      int32 baz = 2 [features.(pb.cpp).string_type = CORD];
    }
  )schema");

  RunProtoc(
      "protocol_compiler --proto_path=$tmpdir --cpp_out=$tmpdir "
      "--experimental_editions foo.proto");

  ExpectErrorSubstring(
      "Field Foo.baz specifies string_type, but is not a string nor bytes "
      "field.");
}